

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_converters.c
# Opt level: O1

void Int24_To_Float32(void *destinationBuffer,int destinationStride,void *sourceBuffer,
                     int sourceStride,uint count,PaUtilTriangularDitherGenerator *ditherGenerator)

{
  uchar *src;
  byte *pbVar1;
  float *dest;
  
  if (count != 0) {
    pbVar1 = (byte *)((long)sourceBuffer + 2);
    do {
      *(float *)destinationBuffer =
           (float)(int)((uint)*pbVar1 << 0x18 | (uint)pbVar1[-1] << 0x10 | (uint)pbVar1[-2] << 8) *
           4.656613e-10;
      destinationBuffer = (void *)((long)destinationBuffer + (long)destinationStride * 4);
      pbVar1 = pbVar1 + sourceStride * 3;
      count = count - 1;
    } while (count != 0);
  }
  return;
}

Assistant:

static void Int24_To_Float32(
    void *destinationBuffer, signed int destinationStride,
    void *sourceBuffer, signed int sourceStride,
    unsigned int count, struct PaUtilTriangularDitherGenerator *ditherGenerator )
{
    unsigned char *src = (unsigned char*)sourceBuffer;
    float *dest = (float*)destinationBuffer;
    PaInt32 temp;

    (void) ditherGenerator; /* unused parameter */

    while( count-- )
    {

#if defined(PA_LITTLE_ENDIAN)
        temp = (((PaInt32)src[0]) << 8);
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 24);
#elif defined(PA_BIG_ENDIAN)
        temp = (((PaInt32)src[0]) << 24);
        temp = temp | (((PaInt32)src[1]) << 16);
        temp = temp | (((PaInt32)src[2]) << 8);
#endif

        *dest = (float) ((double)temp * const_1_div_2147483648_);

        src += sourceStride * 3;
        dest += destinationStride;
    }
}